

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void __thiscall
MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
          (MemoryLeakWarningPlugin *this,SimpleString *name,MemoryLeakDetector *localDetector)

{
  TestPlugin::TestPlugin(&this->super_TestPlugin,name);
  (this->super_TestPlugin)._vptr_TestPlugin = (_func_int **)&PTR__MemoryLeakWarningPlugin_00163fa8;
  this->ignoreAllWarnings_ = false;
  this->destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_ = false;
  this->expectedLeaks_ = 0;
  if (firstPlugin_ == (MemoryLeakWarningPlugin *)0x0) {
    firstPlugin_ = this;
  }
  if (localDetector == (MemoryLeakDetector *)0x0) {
    localDetector = getGlobalDetector();
  }
  this->memLeakDetector_ = localDetector;
  MemoryLeakDetector::enable(localDetector);
  return;
}

Assistant:

MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(const SimpleString& name, MemoryLeakDetector* localDetector) :
    TestPlugin(name), ignoreAllWarnings_(false), destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_(false), expectedLeaks_(0)
{
    if (firstPlugin_ == NULLPTR) firstPlugin_ = this;

    if (localDetector) memLeakDetector_ = localDetector;
    else memLeakDetector_ = getGlobalDetector();

    memLeakDetector_->enable();
}